

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.hpp
# Opt level: O0

void __thiscall
vkt::geometry::Buffer::Buffer
          (Buffer *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkBufferCreateInfo *bufferCreateInfo,MemoryRequirement memoryRequirement)

{
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  Allocator *pAVar2;
  VkDevice pVVar3;
  VkResult result;
  Handle<(vk::HandleType)8> *pHVar4;
  Allocation *pAVar5;
  VkDeviceMemory VVar6;
  VkDeviceSize VVar7;
  VkBufferCreateInfo *this_00;
  VkMemoryRequirements local_c0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_98;
  Move<vk::Handle<(vk::HandleType)8>_> local_78;
  RefData<vk::Handle<(vk::HandleType)8>_> local_58;
  VkBufferCreateInfo *local_38;
  VkBufferCreateInfo *bufferCreateInfo_local;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  Buffer *this_local;
  MemoryRequirement memoryRequirement_local;
  
  local_38 = bufferCreateInfo;
  bufferCreateInfo_local = (VkBufferCreateInfo *)allocator;
  allocator_local = (Allocator *)device;
  device_local = (VkDevice)vk;
  vk_local = (DeviceInterface *)this;
  this_local._4_4_ = memoryRequirement.m_flags;
  ::vk::createBuffer(&local_78,vk,device,bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data_00.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data_00.object.m_internal = local_58.object.m_internal;
  data_00.deleter.m_device = local_58.deleter.m_device;
  data_00.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique(&this->m_buffer,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_78);
  pVVar3 = device_local;
  pAVar2 = allocator_local;
  this_00 = bufferCreateInfo_local;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this);
  ::vk::getBufferMemoryRequirements
            (&local_c0,(DeviceInterface *)pVVar3,(VkDevice)pAVar2,(VkBuffer)pHVar4->m_internal);
  (**(code **)(*(long *)this_00 + 0x18))(&local_a8,this_00,&local_c0,this_local._4_4_);
  local_98 = de::details::MovePtr::operator_cast_to_PtrData(&local_a8,(MovePtr *)this_00);
  data._8_8_ = local_58.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_58.object.m_internal;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            (&this->m_allocation,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a8);
  pVVar3 = device_local;
  pAVar2 = allocator_local;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)this);
  dVar1 = pHVar4->m_internal;
  pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_allocation).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar6 = ::vk::Allocation::getMemory(pAVar5);
  pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_allocation).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar7 = ::vk::Allocation::getOffset(pAVar5);
  result = (**(code **)(*(long *)pVVar3 + 0x60))(pVVar3,pAVar2,dVar1,VVar6.m_internal,VVar7);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryTestsUtil.hpp"
                    ,0x40);
  return;
}

Assistant:

Buffer			(const vk::DeviceInterface&		vk,
														 const vk::VkDevice				device,
														 vk::Allocator&					allocator,
														 const vk::VkBufferCreateInfo&	bufferCreateInfo,
														 const vk::MemoryRequirement	memoryRequirement)

											: m_buffer		(createBuffer(vk, device, &bufferCreateInfo))
											, m_allocation	(allocator.allocate(getBufferMemoryRequirements(vk, device, *m_buffer), memoryRequirement))
										{
											VK_CHECK(vk.bindBufferMemory(device, *m_buffer, m_allocation->getMemory(), m_allocation->getOffset()));
										}